

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_write_header(mcpl_outfileinternal_t *f)

{
  double dVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  uint32_t i;
  undefined8 local_40;
  uint32_t local_38;
  uint32_t local_34;
  undefined8 local_30;
  undefined8 uStack_28;
  uint local_20;
  uint local_1c;
  
  if (f->header_notwritten == 0) {
    pcVar4 = "Logical error!";
  }
  else {
    local_40 = 0x4c3330304c50434d;
    local_38 = 0x1234567;
    sVar2 = fwrite(&local_40,1,8,(FILE *)f->file);
    if (sVar2 == 8) {
      lVar3 = ftell((FILE *)f->file);
      if (lVar3 == 8) {
        sVar2 = fwrite(&f->nparticles,1,8,(FILE *)f->file);
        if (sVar2 == 8) {
          local_38 = f->ncomments;
          local_34 = f->nblobs;
          local_30._0_4_ = f->opt_userflags;
          local_30._4_4_ = f->opt_polarisation;
          uStack_28._0_4_ = f->opt_singleprec;
          uStack_28._4_4_ = f->opt_universalpdgcode;
          local_20 = f->particle_size;
          local_1c = -(uint)(f->opt_universalweight != 0.0) & 1;
          sVar2 = fwrite(&local_38,1,0x20,(FILE *)f->file);
          if (sVar2 == 0x20) {
            dVar1 = f->opt_universalweight;
            if ((dVar1 == 0.0) && (!NAN(dVar1))) {
LAB_00103160:
              pcVar4 = "unknown";
              if (f->hdr_srcprogname != (char *)0x0) {
                pcVar4 = f->hdr_srcprogname;
              }
              mcpl_write_string(f->file,pcVar4,
                                "Errors encountered while attempting to write file header.");
              if (f->ncomments != 0) {
                uVar5 = 0;
                do {
                  mcpl_write_string(f->file,f->comments[uVar5],
                                    "Errors encountered while attempting to write file header.");
                  uVar5 = uVar5 + 1;
                } while (uVar5 < f->ncomments);
              }
              if (f->nblobs != 0) {
                uVar5 = 0;
                do {
                  mcpl_write_string(f->file,f->blobkeys[uVar5],
                                    "Errors encountered while attempting to write file header.");
                  uVar5 = uVar5 + 1;
                } while (uVar5 < f->nblobs);
                if (f->nblobs != 0) {
                  uVar5 = 0;
                  do {
                    mcpl_write_buffer(f->file,f->bloblengths[uVar5],f->blobs[uVar5],
                                      "Errors encountered while attempting to write file header.");
                    uVar5 = uVar5 + 1;
                  } while (uVar5 < f->nblobs);
                }
              }
              free(f->hdr_srcprogname);
              f->hdr_srcprogname = (char *)0x0;
              if (f->ncomments != 0) {
                uVar5 = 0;
                do {
                  free(f->comments[uVar5]);
                  uVar5 = uVar5 + 1;
                } while (uVar5 < f->ncomments);
                free(f->comments);
                f->comments = (char **)0x0;
                f->ncomments = 0;
              }
              if (f->nblobs != 0) {
                uVar5 = 0;
                do {
                  free(f->blobkeys[uVar5]);
                  uVar5 = uVar5 + 1;
                } while (uVar5 < f->nblobs);
                free(f->blobkeys);
                f->blobkeys = (char **)0x0;
                if (f->nblobs != 0) {
                  uVar5 = 0;
                  do {
                    free(f->blobs[uVar5]);
                    uVar5 = uVar5 + 1;
                  } while (uVar5 < f->nblobs);
                }
                free(f->blobs);
                f->blobs = (char **)0x0;
                free(f->bloblengths);
                f->bloblengths = (uint32_t *)0x0;
                f->nblobs = 0;
              }
              f->header_notwritten = 0;
              return;
            }
            sVar2 = fwrite(&f->opt_universalweight,1,8,(FILE *)f->file);
            if (sVar2 == 8) goto LAB_00103160;
          }
        }
      }
    }
    pcVar4 = "Errors encountered while attempting to write file header.";
  }
  (*mcpl_error_handler)(pcVar4);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_write_header(mcpl_outfileinternal_t * f)
{
  if (!f->header_notwritten)
    mcpl_error("Logical error!");

  const char * errmsg="Errors encountered while attempting to write file header.";
  //Always start the file with an unsigned char-array (for endian agnosticity)
  //containing magic word (MCPL), file format version ('001'-'999') and
  //endianness used in the file ('L' or 'B'):
  unsigned char start[8] = {'M','C','P','L','0','0','0','L'};
  start[4] = (MCPL_FORMATVERSION/100)%10 + '0';
  start[5] = (MCPL_FORMATVERSION/10)%10 + '0';
  start[6] = MCPL_FORMATVERSION%10 + '0';
  if (!mcpl_platform_is_little_endian())
    start[7] = 'B';
  size_t nb = fwrite(start, 1, sizeof(start), f->file);
  if (nb!=sizeof(start))
    mcpl_error(errmsg);

  //Right after the initial 8 bytes, we put the number of particles (0 for now,
  //but important that position is fixed so we can seek and update it later).:
  int64_t nparticles_pos = MCPL_FTELL(f->file);
  if (nparticles_pos!=MCPLIMP_NPARTICLES_POS)
    mcpl_error(errmsg);
  nb = fwrite(&f->nparticles, 1, sizeof(f->nparticles), f->file);
  if (nb!=sizeof(f->nparticles))
    mcpl_error(errmsg);

  //Then a bunch of numbers:
  uint32_t arr[8];
  arr[0] = f->ncomments;
  arr[1] = f->nblobs;
  arr[2] = f->opt_userflags;
  arr[3] = f->opt_polarisation;
  arr[4] = f->opt_singleprec;
  arr[5] = (uint32_t)f->opt_universalpdgcode;
  arr[6] = f->particle_size;
  arr[7] = (f->opt_universalweight?1:0);
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  nb = fwrite(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);

  if (f->opt_universalweight) {
    MCPL_STATIC_ASSERT(sizeof(f->opt_universalweight)==8);
    nb = fwrite((void*)(&(f->opt_universalweight)), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
  }

  //strings:
  mcpl_write_string(f->file,f->hdr_srcprogname?f->hdr_srcprogname:"unknown",errmsg);
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    mcpl_write_string(f->file,f->comments[i],errmsg);

  //blob keys:
  for (i = 0; i < f->nblobs; ++i)
    mcpl_write_string(f->file,f->blobkeys[i],errmsg);

  //blobs:
  for (i = 0; i < f->nblobs; ++i)
    mcpl_write_buffer(f->file, f->bloblengths[i], f->blobs[i],errmsg);

  //Free up acquired memory only needed for header writing:
  free(f->hdr_srcprogname);
  f->hdr_srcprogname = NULL;
  if (f->ncomments) {
    for (i = 0; i < f->ncomments; ++i)
      free(f->comments[i]);
    free(f->comments);
    f->comments = NULL;
    f->ncomments = 0;
  }
  if (f->nblobs) {
    for (i = 0; i < f->nblobs; ++i)
      free(f->blobkeys[i]);
    free(f->blobkeys);
    f->blobkeys = NULL;
    for (i = 0; i < f->nblobs; ++i)
      free(f->blobs[i]);
    free(f->blobs);
    f->blobs = NULL;
    free(f->bloblengths);
    f->bloblengths = NULL;
    f->nblobs = 0;
  }
  f->header_notwritten = 0;
}